

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_parse.c
# Opt level: O0

MPP_RET parse_prepare_avcC_data(H264dInputCtx_t *p_Inp,H264dCurCtx_t *p_Cur)

{
  MppPacket pvVar1;
  RK_U32 RVar2;
  h264d_curstrm_t *p_strm_00;
  MppPacketImpl *pkt_impl;
  H264dCurStream_t *p_strm;
  MPP_RET ret;
  H264dCurCtx_t *p_Cur_local;
  H264dInputCtx_t *p_Inp_local;
  
  p_strm._4_4_ = MPP_ERR_UNKNOW;
  p_strm_00 = &p_Cur->strm;
  pvVar1 = p_Inp->in_pkt;
  (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
  p_Inp->task_valid = '\0';
  if (p_Inp->pkt_eos != 0) {
    p_Inp->task_eos = 1;
    if (p_Inp->in_length != 0) {
      p_Inp->task_valid = '\x01';
    }
    return MPP_OK;
  }
  if (p_Inp->nal_size == 0) {
    p_strm._4_4_ = MPP_ERR_VALUE;
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_parse","value error(%d).\n",(char *)0x0,0x388);
    }
  }
  else {
    (p_Cur->strm).curdata = p_Inp->in_buf + p_strm_00->nalu_offset;
    do {
      if (p_Inp->in_length == 0) goto LAB_001bae27;
      if ((p_Cur->strm).startcode_found != '\0') {
        RVar2 = parse_nal_size((RK_U8)p_Inp->nal_size,(p_Cur->strm).curdata);
        (p_Cur->strm).nalu_len = RVar2;
        if (((p_Cur->strm).nalu_len == 0) || (p_Inp->in_length <= (ulong)(p_Cur->strm).nalu_len)) {
          p_Cur->p_Dec->is_new_frame = '\x01';
          p_Cur->p_Dec->have_slice_data = '\0';
          *(undefined8 *)((long)pvVar1 + 0x20) = 0;
          p_Inp->in_length = 0;
          (p_Cur->strm).nalu_len = 0;
          p_strm_00->nalu_offset = 0;
          (p_Cur->strm).startcode_found = '\x01';
          (p_Cur->strm).endcode_found = '\0';
          (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
          goto LAB_001baf0c;
        }
        (p_Cur->strm).nalu_buf = (p_Cur->strm).curdata + p_Inp->nal_size;
        judge_is_new_frame(p_Cur,p_strm_00);
        if (p_Cur->p_Dec->is_new_frame != '\0') {
          p_Cur->p_Dec->have_slice_data = '\0';
          (p_Cur->strm).startcode_found = '\x01';
          (p_Cur->strm).endcode_found = '\0';
          goto LAB_001bae27;
        }
        (p_Cur->strm).curdata = (p_Cur->strm).curdata + p_Inp->nal_size;
        p_strm_00->nalu_offset = p_Inp->nal_size + p_strm_00->nalu_offset;
        *(ulong *)((long)pvVar1 + 0x20) = *(long *)((long)pvVar1 + 0x20) - (ulong)p_Inp->nal_size;
        p_Inp->in_length = p_Inp->in_length - (ulong)p_Inp->nal_size;
        (p_Cur->strm).nalu_buf = (p_Cur->strm).curdata;
        (p_Cur->strm).nalu_type = *(p_Cur->strm).nalu_buf & 0x1f;
        (p_Cur->strm).startcode_found = '\0';
        (p_Cur->strm).endcode_found = '\x01';
        p_strm._4_4_ = store_cur_nalu(p_Cur,p_strm_00,p_Cur->p_Dec->dxva_ctx);
        if (p_strm._4_4_ < MPP_OK) {
          if ((h264d_debug & 4) != 0) {
            _mpp_log_l(4,"h264d_parse","Function error(%d).\n",(char *)0x0,0x3ad);
          }
          goto LAB_001baf0c;
        }
        (p_Cur->strm).curdata = (p_Cur->strm).curdata + (p_Cur->strm).nalu_len;
        p_strm_00->nalu_offset = (p_Cur->strm).nalu_len + p_strm_00->nalu_offset;
        *(ulong *)((long)pvVar1 + 0x20) =
             *(long *)((long)pvVar1 + 0x20) - (ulong)(p_Cur->strm).nalu_len;
        p_Inp->in_length = p_Inp->in_length - (ulong)(p_Cur->strm).nalu_len;
        (p_Cur->strm).startcode_found = '\x01';
        (p_Cur->strm).endcode_found = '\0';
        (p_Cur->strm).nalu_len = 0;
      }
    } while ((ulong)p_Inp->nal_size <= p_Inp->in_length);
    p_Cur->p_Dec->is_new_frame = '\x01';
    p_Cur->p_Dec->have_slice_data = '\0';
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
    p_Inp->in_length = 0;
    (p_Cur->strm).nalu_len = 0;
    p_strm_00->nalu_offset = 0;
    (p_Cur->strm).startcode_found = '\x01';
    (p_Cur->strm).endcode_found = '\0';
    (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
LAB_001bae27:
    if (p_Cur->p_Dec->is_new_frame != '\0') {
      if ((p_Cur->strm).tmp_offset != 0) {
        clear_extra_header(p_strm_00);
      }
      p_strm._4_4_ = add_empty_nalu(p_strm_00);
      if (p_strm._4_4_ < MPP_OK) {
        if ((h264d_debug & 4) != 0) {
          _mpp_log_l(4,"h264d_parse","Function error(%d).\n",(char *)0x0,0x3c9);
        }
        goto LAB_001baf0c;
      }
      (p_Cur->strm).head_offset = 0;
      (p_Cur->strm).first_mb_in_slice = 0;
      p_Cur->p_Inp->task_valid = '\x01';
      p_Cur->p_Dec->is_new_frame = '\0';
      p_Cur->last_dts = p_Inp->in_dts;
      p_Cur->last_pts = p_Inp->in_pts;
    }
    (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
    p_strm._4_4_ = MPP_OK;
  }
LAB_001baf0c:
  p_Cur->last_dts = p_Inp->in_dts;
  p_Cur->last_pts = p_Inp->in_pts;
  p_Inp->p_Dec->nalu_ret = HaveNoStream;
  return p_strm._4_4_;
}

Assistant:

MPP_RET parse_prepare_avcC_data(H264dInputCtx_t *p_Inp, H264dCurCtx_t *p_Cur)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    H264dCurStream_t *p_strm = &p_Cur->strm;
    MppPacketImpl *pkt_impl  = (MppPacketImpl *)p_Inp->in_pkt;

    p_strm->nalu_buf = NULL;
    p_Inp->task_valid = 0;
    if (p_Inp->pkt_eos) {
        p_Inp->task_eos = 1;
        if (p_Inp->in_length)
            p_Inp->task_valid = 1;
        return MPP_OK;
    }
    VAL_CHECK(ret, (p_Inp->nal_size > 0));
    p_strm->curdata = &p_Inp->in_buf[p_strm->nalu_offset];
    while (p_Inp->in_length > 0) {
        if (p_strm->startcode_found) {
            p_strm->nalu_len = parse_nal_size(p_Inp->nal_size, p_strm->curdata);
            if (p_strm->nalu_len <= 0 ||  p_strm->nalu_len >= p_Inp->in_length) {
                p_Cur->p_Dec->is_new_frame = 1;
                p_Cur->p_Dec->have_slice_data = 0;
                pkt_impl->length = 0;
                p_Inp->in_length = 0;
                p_strm->nalu_len = 0;
                p_strm->nalu_offset = 0;
                p_strm->startcode_found = 1;
                p_strm->endcode_found = 0;
                p_strm->nalu_buf  = NULL;
                goto __FAILED;
            }

            p_strm->nalu_buf = p_strm->curdata + p_Inp->nal_size;
            judge_is_new_frame(p_Cur, p_strm);
            if (p_Cur->p_Dec->is_new_frame) {
                p_Cur->p_Dec->have_slice_data = 0;
                p_strm->startcode_found = 1;
                p_strm->endcode_found = 0;
                break;
            }

            p_strm->curdata += p_Inp->nal_size;
            p_strm->nalu_offset += p_Inp->nal_size;
            pkt_impl->length -= p_Inp->nal_size;
            p_Inp->in_length -= p_Inp->nal_size;

            p_strm->nalu_buf = p_strm->curdata;
            p_strm->nalu_type = p_strm->nalu_buf[0] & 0x1F;
            p_strm->startcode_found = 0;
            p_strm->endcode_found = 1;

            FUN_CHECK(ret = store_cur_nalu(p_Cur, p_strm, p_Cur->p_Dec->dxva_ctx));
            p_strm->curdata += p_strm->nalu_len;
            p_strm->nalu_offset += p_strm->nalu_len;
            pkt_impl->length -= p_strm->nalu_len;
            p_Inp->in_length -= p_strm->nalu_len;
            p_strm->startcode_found = 1;
            p_strm->endcode_found = 0;
            p_strm->nalu_len = 0;
        }

        if (p_Inp->in_length < p_Inp->nal_size) {
            p_Cur->p_Dec->is_new_frame = 1;
            p_Cur->p_Dec->have_slice_data = 0;
            pkt_impl->length = 0;
            p_Inp->in_length = 0;
            p_strm->nalu_len = 0;
            p_strm->nalu_offset = 0;
            p_strm->startcode_found = 1;
            p_strm->endcode_found = 0;
            p_strm->nalu_buf  = NULL;
            break;
        }
    }
    //!< one frame end
    if (p_Cur->p_Dec->is_new_frame) {
        if (p_strm->tmp_offset)
            clear_extra_header(p_strm);
        //!< add an empty nalu to tell frame end
        FUN_CHECK(ret = add_empty_nalu(p_strm));
        //!< reset curstream parameters
        p_strm->head_offset = 0;
        p_strm->first_mb_in_slice = 0;
        p_Cur->p_Inp->task_valid = 1;
        p_Cur->p_Dec->is_new_frame = 0;

        p_Cur->last_dts = p_Inp->in_dts;
        p_Cur->last_pts = p_Inp->in_pts;
    }
    p_strm->nalu_buf = NULL;
    ret = MPP_OK;
__FAILED:
    //p_strm->nalu_len = 0;
    p_Cur->last_dts  = p_Inp->in_dts;
    p_Cur->last_pts  = p_Inp->in_pts;
    p_Inp->p_Dec->nalu_ret = HaveNoStream;

    return ret;
}